

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O2

bool __thiscall lzham::symbol_codec::start_encoding(symbol_codec *this,uint expected_file_size)

{
  bool bVar1;
  
  this->m_mode = cEncoding;
  this->m_total_model_updates = 0;
  this->m_total_bits_written = 0;
  bVar1 = put_bits_init(this,expected_file_size);
  if (bVar1) {
    vector<lzham::symbol_codec::output_symbol>::try_resize(&this->m_output_syms,0,false);
    arith_start_encoding(this);
  }
  return bVar1;
}

Assistant:

bool symbol_codec::start_encoding(uint expected_file_size)
   {
      m_mode = cEncoding;

      m_total_model_updates = 0;
      m_total_bits_written = 0;

      if (!put_bits_init(expected_file_size))
         return false;

      m_output_syms.try_resize(0);

      arith_start_encoding();

      return true;
   }